

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FoundationPileTests.cpp
# Opt level: O0

void __thiscall
solitaire::piles::FoundationPileWithAceTest_tryAddCardWithDifferentSuitThanOnTopOfPile_Test::
TestBody(FoundationPileWithAceTest_tryAddCardWithDifferentSuitThanOnTopOfPile_Test *this)

{
  Card *this_00;
  optional<solitaire::cards::Card> *this_01;
  bool bVar1;
  element_type *peVar2;
  char *pcVar3;
  vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *rhs;
  PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>_>
  *matcher;
  AssertHelper local_a8;
  Message local_a0;
  PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>_>
  local_98;
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>_>_>
  local_80;
  undefined1 local_68 [8];
  AssertionResult gtest_ar_1;
  Message local_50 [3];
  undefined1 local_38 [8];
  AssertionResult gtest_ar;
  optional<solitaire::cards::Card> cardToAdd;
  Card cardWithDifferentSuitThanOnTopOfPile;
  FoundationPileWithAceTest_tryAddCardWithDifferentSuitThanOnTopOfPile_Test *this_local;
  
  this_00 = (Card *)((long)&cardToAdd.super__Optional_base<solitaire::cards::Card,_true,_true>.
                            _M_payload.super__Optional_payload_base<solitaire::cards::Card>.
                            _M_payload + 4);
  solitaire::cards::Card::Card(this_00,Two,Spade);
  this_01 = (optional<solitaire::cards::Card> *)
            ((long)&gtest_ar.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl + 4);
  std::optional<solitaire::cards::Card>::optional<const_solitaire::cards::Card_&,_true>
            (this_01,this_00);
  peVar2 = std::
           __shared_ptr_access<solitaire::piles::FoundationPile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<solitaire::piles::FoundationPile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&(this->super_FoundationPileWithAceTest).super_EmptyFoundationPileTest.
                            pile);
  (*(peVar2->super_FoundationPile).super_Archiver._vptr_Archiver[4])(peVar2,this_01);
  testing::internal::EqHelper::
  Compare<std::optional<solitaire::cards::Card>,_solitaire::cards::Card,_nullptr>
            ((EqHelper *)local_38,"cardToAdd","cardWithDifferentSuitThanOnTopOfPile",this_01,this_00
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    testing::Message::Message(local_50);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_38);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/piles/FoundationPileTests.cpp"
               ,0x6f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  testing::ContainerEq<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>>
            (&local_98,(testing *)&(this->super_FoundationPileWithAceTest).pileCards,rhs);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>>>>
            (&local_80,(internal *)&local_98,matcher);
  peVar2 = std::
           __shared_ptr_access<solitaire::piles::FoundationPile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<solitaire::piles::FoundationPile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&(this->super_FoundationPileWithAceTest).super_EmptyFoundationPileTest.
                            pile);
  (*(peVar2->super_FoundationPile).super_Archiver._vptr_Archiver[6])();
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>>>>
  ::operator()(local_68,(char *)&local_80,
               (vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)
               "pile->getCards()");
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>_>_>
  ::~PredicateFormatterFromMatcher(&local_80);
  testing::
  PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>_>
  ::~PolymorphicMatcher(&local_98);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar1) {
    testing::Message::Message(&local_a0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_68);
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/piles/FoundationPileTests.cpp"
               ,0x70,pcVar3);
    testing::internal::AssertHelper::operator=(&local_a8,&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    testing::Message::~Message(&local_a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  return;
}

Assistant:

TEST_F(FoundationPileWithAceTest,
       tryAddCardWithDifferentSuitThanOnTopOfPile)
{
    const Card cardWithDifferentSuitThanOnTopOfPile {Value::Two, Suit::Spade};
    std::optional<Card> cardToAdd = cardWithDifferentSuitThanOnTopOfPile;

    pile->tryAddCard(cardToAdd);

    EXPECT_EQ(cardToAdd, cardWithDifferentSuitThanOnTopOfPile);
    EXPECT_THAT(pile->getCards(), ContainerEq(pileCards));
}